

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::setAttributes
          (Compilation *this,Symbol *symbol,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ulong pos0;
  uint uVar6;
  ulong hash;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  try_emplace_args_t local_71;
  flat_hash_map<const_void_*,_std::span<const_AttributeSymbol_*const>_> *local_70;
  Symbol *local_68;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_70 = &this->attributeMap;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = symbol;
  hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->attributeMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar3 = (this->attributeMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
           .arrays.elements_;
  local_60 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_size_mask;
  uVar9 = 0;
  uVar8 = pos0;
  do {
    pgVar1 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_ + uVar8;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bStack_49 = pgVar1->m[0xf].n;
    uVar10 = (uchar)uVar2;
    auVar14[0] = -(local_58 == uVar10);
    uVar11 = (uchar)((uint)uVar2 >> 8);
    auVar14[1] = -(uStack_57 == uVar11);
    uVar12 = (uchar)((uint)uVar2 >> 0x10);
    auVar14[2] = -(uStack_56 == uVar12);
    bVar13 = (byte)((uint)uVar2 >> 0x18);
    auVar14[3] = -(bStack_55 == bVar13);
    auVar14[4] = -(uStack_54 == uVar10);
    auVar14[5] = -(uStack_53 == uVar11);
    auVar14[6] = -(uStack_52 == uVar12);
    auVar14[7] = -(bStack_51 == bVar13);
    auVar14[8] = -(uStack_50 == uVar10);
    auVar14[9] = -(uStack_4f == uVar11);
    auVar14[10] = -(uStack_4e == uVar12);
    auVar14[0xb] = -(bStack_4d == bVar13);
    auVar14[0xc] = -(uStack_4c == uVar10);
    auVar14[0xd] = -(uStack_4b == uVar11);
    auVar14[0xe] = -(uStack_4a == uVar12);
    auVar14[0xf] = -(bStack_49 == bVar13);
    for (uVar6 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe); uVar6 != 0;
        uVar6 = uVar6 - 1 & uVar6) {
      uVar4 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if ((Symbol *)ppVar3[uVar8 * 0xf + (ulong)uVar4].first == symbol) {
        local_48.p = ppVar3 + uVar8 * 0xf + (ulong)uVar4;
        goto LAB_00383fce;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
    lVar7 = uVar8 + uVar9;
    uVar9 = uVar9 + 1;
    uVar8 = lVar7 + 1U & local_60;
  } while (uVar9 <= local_60);
  local_68 = symbol;
  if ((this->attributeMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
      .size_ctrl.size <
      (this->attributeMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
    ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                *)local_70,pos0,hash,&local_71,&local_68);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
    ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                *)local_70,hash,&local_71,&local_68);
  }
LAB_00383fce:
  ((local_48.p)->second)._M_ptr = attributes._M_ptr;
  ((local_48.p)->second)._M_extent._M_extent_value =
       attributes._M_extent._M_extent_value._M_extent_value;
  return;
}

Assistant:

void Compilation::setAttributes(const Symbol& symbol,
                                std::span<const AttributeSymbol* const> attributes) {
    attributeMap[&symbol] = attributes;
}